

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hh
# Opt level: O0

size_t __thiscall
tchecker::
periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
::collect(periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
          *this)

{
  ulong uVar1;
  unsigned_long uVar2;
  size_t n;
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  *this_local;
  
  if (this->_count < this->_period) {
    this->_count = this->_count + 1;
    this_local = (periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                  *)0x0;
  }
  else {
    this_local = (periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                  *)cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                    ::collect(&this->
                               super_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
                             );
    if (this_local ==
        (periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
         *)0x0) {
      uVar1 = this->_period;
      uVar2 = std::numeric_limits<unsigned_long>::max();
      if (uVar1 < uVar2 >> 1) {
        this->_period = this->_period << 1;
      }
    }
    else {
      this->_period = 1;
    }
    this->_count = 1;
  }
  return (size_t)this_local;
}

Assistant:

virtual std::size_t collect()
  {
    if (_count >= _period) {
      std::size_t n = tchecker::cache_t<SPTR, HASH, EQUAL>::collect();
      if (n > 0)
        _period = 1;
      else if (_period < std::numeric_limits<std::size_t>::max() / 2)
        _period *= 2;
      _count = 1;
      return n;
    }

    ++_count;
    return 0;
  }